

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

bool __thiscall Assimp::Importer::SetPropertyMatrix(Importer *this,char *szName,aiMatrix4x4 *value)

{
  bool bVar1;
  bool existing;
  aiMatrix4x4 *value_local;
  char *szName_local;
  Importer *this_local;
  
  if (this->pimpl != (ImporterPimpl *)0x0) {
    bVar1 = SetGenericProperty<aiMatrix4x4t<float>>(&this->pimpl->mMatrixProperties,szName,value);
    return bVar1;
  }
  __assert_fail("nullptr != pimpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                ,0x417,"bool Assimp::Importer::SetPropertyMatrix(const char *, const aiMatrix4x4 &)"
               );
}

Assistant:

bool Importer::SetPropertyMatrix(const char* szName, const aiMatrix4x4& value) {
    ai_assert(nullptr != pimpl);
    
    bool existing;
    ASSIMP_BEGIN_EXCEPTION_REGION();
        existing = SetGenericProperty<aiMatrix4x4>(pimpl->mMatrixProperties, szName,value);
    ASSIMP_END_EXCEPTION_REGION(bool);
    return existing;
}